

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Viper.cpp
# Opt level: O3

void __thiscall chrono::viper::Viper::Update(Viper *this)

{
  undefined8 uVar1;
  double dVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  element_type *peVar5;
  int iVar6;
  long lVar7;
  double dVar8;
  
  uVar1 = *(undefined8 *)(this->m_system + 0x1a8);
  (*((this->m_driver).super___shared_ptr<chrono::viper::ViperDriver,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr)->_vptr_ViperDriver[3])();
  lVar7 = -0x20;
  do {
    peVar5 = (this->m_driver).
             super___shared_ptr<chrono::viper::ViperDriver,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    dVar2 = *(double *)((long)(peVar5->lift_angles)._M_elems + lVar7);
    dVar8 = -0.5235987755982988;
    if ((-0.5235987755982988 <= dVar2) && (dVar8 = dVar2, 0.5235987755982988 < dVar2)) {
      dVar8 = 0.5235987755982988;
    }
    uVar3 = *(undefined8 *)((long)peVar5[1].drive_speeds._M_elems + lVar7 + -0x10);
    uVar4 = *(undefined8 *)((long)(peVar5->steer_angles)._M_elems + lVar7);
    *(double *)
     (*(long *)((long)&(this->m_lift_motor_funcs)._M_elems[0].
                       super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr + lVar7 * 2) + 8) = dVar8;
    *(undefined8 *)
     (*(long *)((long)&(this->m_springs)._M_elems[0].
                       super___shared_ptr<chrono::ChLinkTSDA,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
               lVar7 * 2) + 8) = uVar3;
    iVar6 = (*peVar5->_vptr_ViperDriver[2])();
    if (iVar6 == 0) {
      (**(code **)(**(long **)((long)&(this->m_steer_motor_funcs)._M_elems[0].
                                      super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + lVar7 * 2) + 0xd0))(uVar4,uVar1);
    }
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0);
  return;
}

Assistant:

void Viper::Update() {
    double time = m_system->GetChTime();
    m_driver->Update(time);

    for (int i = 0; i < 4; i++) {
        // Extract driver inputs
        double driving = m_driver->drive_speeds[i];
        double steering = m_driver->steer_angles[i];
        double lifting = m_driver->lift_angles[i];

        // Enforce maximum steering angle
        ChClampValue(steering, -m_max_steer_angle, +m_max_steer_angle);

        // Set motor functions
        m_steer_motor_funcs[i]->Set_yconst(steering);
        m_lift_motor_funcs[i]->Set_yconst(lifting);
        if (m_driver->GetDriveMotorType() == ViperDriver::DriveMotorType::SPEED)
            m_drive_motor_funcs[i]->SetSetpoint(driving, time);
    }
}